

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O2

void sliding_window_memory_management(H264_DpbBuf_t *p_Dpb)

{
  H264_DecCtx_t *p_Dec;
  int iVar1;
  ulong uVar2;
  H264_FrameStore_t *in_RSI;
  
  iVar1 = 1;
  if (1 < p_Dpb->num_ref_frames) {
    iVar1 = p_Dpb->num_ref_frames;
  }
  if (p_Dpb->ref_frames_in_buffer == iVar1 - p_Dpb->ltref_frames_in_buffer) {
    for (uVar2 = 0; p_Dpb->used_size != uVar2; uVar2 = uVar2 + 1) {
      p_Dec = (H264_DecCtx_t *)p_Dpb->fs[uVar2];
      if ((*(int *)((long)&p_Dec->mem + 4) != 0) && (*(int *)&p_Dec->dpb_mark == 0)) {
        unmark_for_reference(p_Dec,in_RSI);
        update_ref_list(p_Dpb);
        return;
      }
    }
  }
  return;
}

Assistant:

static void sliding_window_memory_management(H264_DpbBuf_t *p_Dpb)
{
    RK_U32 i = 0;

    // if this is a reference pic with sliding window, unmark first ref frame
    if (p_Dpb->ref_frames_in_buffer == MPP_MAX(1, p_Dpb->num_ref_frames) - p_Dpb->ltref_frames_in_buffer) {
        for (i = 0; i < p_Dpb->used_size; i++) {
            if (p_Dpb->fs[i]->is_reference && (!(p_Dpb->fs[i]->is_long_term))) {
                unmark_for_reference(p_Dpb->p_Vid->p_Dec, p_Dpb->fs[i]);
                update_ref_list(p_Dpb);
                break;
            }
        }
    }
}